

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O2

void borg_follow_kill(wchar_t i)

{
  short sVar1;
  short sVar2;
  wchar_t x;
  wchar_t y;
  wchar_t wVar3;
  wchar_t wVar4;
  borg_grid *pbVar5;
  chunk_conflict *c;
  _Bool _Var6;
  uint32_t uVar7;
  int iVar8;
  char *pcVar9;
  loc grid;
  wchar_t wVar10;
  wchar_t wVar11;
  borg_kill *pbVar12;
  long lVar13;
  int local_48;
  int local_44;
  
  if (borg_kills[i].r_idx != 0) {
    pbVar12 = borg_kills + i;
    x = (pbVar12->pos).x;
    y = (pbVar12->pos).y;
    _Var6 = borg_follow_kill_aux(i,y,x);
    if (_Var6) {
      pcVar9 = borg_race_name((uint)pbVar12->r_idx);
      pcVar9 = format("# There was a monster \'%s\' at (%d,%d)",pcVar9,(ulong)(uint)y,(ulong)(uint)x
                     );
      borg_note(pcVar9);
      _Var6 = borg_cave_floor_bold(y,x);
      if (((_Var6) && (uVar7 = Rand_div(100), -1 < (int)uVar7)) && (borg_t < 0x4e21)) {
        _Var6 = flag_has_dbg(r_info[pbVar12->r_idx].flags,0xb,0x15,"r_info[kill->r_idx].flags",
                             "RF_NEVER_MOVE");
        if ((_Var6) || (pbVar12->awake == false)) {
          if ((pbVar12->pos).y != borg.c.y) {
            return;
          }
          if ((pbVar12->pos).x != borg.c.x) {
            return;
          }
        }
        else {
          local_44 = 0;
          local_48 = 0;
          for (lVar13 = 0; c = cave, lVar13 != 8; lVar13 = lVar13 + 1) {
            sVar1 = ddx_ddd[lVar13];
            sVar2 = ddy_ddd[lVar13];
            wVar10 = sVar1 + x;
            wVar11 = y + sVar2;
            grid = (loc)loc(wVar10,wVar11);
            _Var6 = square_in_bounds_fully(c,grid);
            if (_Var6) {
              pbVar5 = borg_grids[wVar11];
              _Var6 = borg_cave_floor_grid(pbVar5 + wVar10);
              if (((_Var6) && (pbVar5[wVar10].kill == '\0')) &&
                 (_Var6 = borg_follow_kill_aux(i,wVar11,wVar10), !_Var6)) {
                local_44 = local_44 + sVar1;
                local_48 = local_48 + sVar2;
              }
            }
          }
          if (0 < local_44) {
            local_44 = 1;
          }
          if (local_44 < 0) {
            local_44 = -1;
          }
          iVar8 = 1;
          if (local_48 < 1) {
            iVar8 = local_48;
          }
          if (iVar8 < 0) {
            iVar8 = -1;
          }
          wVar11 = local_44 + x;
          wVar10 = iVar8 + y;
          pbVar5 = borg_grids[wVar10];
          _Var6 = borg_cave_floor_grid(pbVar5 + wVar11);
          if ((_Var6) && ((uint)pbVar5[wVar11].kill == i)) {
            wVar3 = (pbVar12->pos).y;
            wVar4 = (pbVar12->pos).x;
            if (wVar4 != x || wVar3 != y) {
              borg_grids[wVar3][wVar4].kill = '\0';
              pbVar12->ox = (uint8_t)x;
              pbVar12->oy = (uint8_t)y;
              (pbVar12->pos).x = wVar11;
              (pbVar12->pos).y = wVar10;
              borg_grids[wVar10][wVar11].kill = (uint8_t)i;
              pcVar9 = borg_race_name((uint)pbVar12->r_idx);
              pcVar9 = format("# Following a monster \'%s\' to (%d,%d) from (%d,%d)",pcVar9,
                              (ulong)(uint)wVar10,(ulong)(uint)wVar11,(ulong)(uint)y,(ulong)(uint)x)
              ;
              borg_note(pcVar9);
              if (borg.goal.type == 1 && borg.trait[0x25] == 0) {
                if ((pbVar12->pos).y != (uint)borg_flow_y[0]) {
                  borg_danger_wipe = true;
                  return;
                }
                if ((pbVar12->pos).x != (uint)borg_flow_x[0]) {
                  borg_danger_wipe = true;
                  return;
                }
              }
              else {
                if (borg.goal.type != 2) {
                  borg_danger_wipe = true;
                  return;
                }
                if (borg.munchkin_mode != true) {
                  borg_danger_wipe = true;
                  return;
                }
              }
              borg_danger_wipe = true;
              borg.goal.type = 0;
              return;
            }
          }
        }
      }
      borg_delete_kill(i);
      return;
    }
  }
  return;
}

Assistant:

void borg_follow_kill(int i)
{
    int j;
    int x, y;
    int ox, oy;

    int dx, b_dx = 0;
    int dy, b_dy = 0;

    borg_grid *ag;

    borg_kill *kill = &borg_kills[i];

    /* Paranoia */
    if (!kill->r_idx)
        return;

    /* Old location */
    ox = kill->pos.x;
    oy = kill->pos.y;

    /* Out of sight */
    if (!borg_follow_kill_aux(i, oy, ox))
        return;

    /* Note */
    borg_note(format("# There was a monster '%s' at (%d,%d)",
        borg_race_name(kill->r_idx), oy, ox));

    /* Prevent silliness */
    if (!borg_cave_floor_bold(oy, ox)) {
        /* Delete the monster */
        borg_delete_kill(i);

        /* Done */
        return;
    }

    /* Prevent loops */
    if (randint1(100) < 1) {
        /* Just delete the monster */
        borg_delete_kill(i);

        /* Done */
        return;
    }

    /* prevent overflows */
    if (borg_t > 20000) {
        /* Just delete the monster */
        borg_delete_kill(i);

        /* Done */
        return;
    }

    /* Some never move, no reason to follow them */
    if ((rf_has(r_info[kill->r_idx].flags, RF_NEVER_MOVE)) ||
        /* Some are sleeping and don't move, no reason to follow them */
        (kill->awake == false)) {
        /* delete them if they are under me */
        if (kill->pos.y == borg.c.y && kill->pos.x == borg.c.x) {
            borg_delete_kill(i);
        }
        /* Don't 'forget' certain ones */
        return;
    }

    /* Scan locations */
    for (j = 0; j < 8; j++) {
        /* Access offset */
        dx = ddx_ddd[j];
        dy = ddy_ddd[j];

        /* Access location */
        x = ox + dx;
        y = oy + dy;

        /* legal */
        if (!square_in_bounds_fully(cave, loc(x, y)))
            continue;

        /* Access the grid */
        ag = &borg_grids[y][x];

        /* Skip known walls and doors */
        if (!borg_cave_floor_grid(ag))
            continue;

        /* Skip known monsters */
        if (ag->kill)
            continue;

        /* Skip visible grids */
        if (borg_follow_kill_aux(i, y, x))
            continue;

        /* Collect the offsets */
        b_dx += dx;
        b_dy += dy;
    }

    /* Don't go too far */
    if (b_dx < -1)
        b_dx = -1;
    else if (b_dx > 1)
        b_dx = 1;

    /* Don't go too far */
    if (b_dy < -1)
        b_dy = -1;
    else if (b_dy > 1)
        b_dy = 1;

    /* Access location */
    x = ox + b_dx;
    y = oy + b_dy;

    /* Access the grid */
    ag = &borg_grids[y][x];

    /* Avoid walls and doors */
    if (!borg_cave_floor_grid(ag)) {
        /* Just delete the monster */
        borg_delete_kill(i);

        /* Done */
        return;
    }

    /* Avoid monsters */
    if (ag->kill != i) {
        /* Just delete the monster */
        borg_delete_kill(i);

        /* Done */
        return;
    }

    /* Delete monsters that did not really move */
    if (kill->pos.y == oy && kill->pos.x == ox) {
        borg_delete_kill(i);
        return;
    }

    /* Update the grids */
    borg_grids[kill->pos.y][kill->pos.x].kill = 0;

    /* Save the old Location */
    kill->ox = ox;
    kill->oy = oy;

    /* Save the Location */
    kill->pos.x = ox + b_dx;
    kill->pos.y = oy + b_dy;

    /* Update the grids */
    borg_grids[kill->pos.y][kill->pos.x].kill = i;

    /* Note */
    borg_note(format("# Following a monster '%s' to (%d,%d) from (%d,%d)",
        borg_race_name(kill->r_idx), kill->pos.y, kill->pos.x, oy, ox));

    /* Recalculate danger */
    borg_danger_wipe = true;

    /* Clear goals */
    if ((!borg.trait[BI_ESP] && borg.goal.type == GOAL_KILL
            && (borg_flow_y[0] == kill->pos.y && borg_flow_x[0] == kill->pos.x))
        || (borg.goal.type == GOAL_TAKE && borg.munchkin_mode))
        borg.goal.type = 0;
}